

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack8_8(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = *in;
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  auVar6._8_8_ = 0x1000000008;
  auVar6._0_8_ = 0x1000000008;
  auVar4 = vpbroadcastd_avx512vl();
  auVar6 = vpshufd_avx(auVar6,0x50);
  auVar3 = vpsrlvd_avx2(auVar5,auVar6);
  auVar3 = vpblendd_avx2(auVar3,auVar5,1);
  auVar2 = vpblendd_avx2(ZEXT1632(auVar3),auVar4,0x10);
  auVar6 = vpsrlvd_avx2(auVar4._0_16_,auVar6);
  auVar4._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar2._0_16_;
  auVar4._16_16_ = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar6;
  auVar4 = vpblendd_avx2(auVar2,auVar4,0x60);
  auVar4 = vpand_avx2(auVar4,_DAT_001a6460);
  auVar2 = vpshufb_avx2(auVar2,_DAT_001a6480);
  auVar4 = vpblendd_avx2(auVar4,auVar2,0x88);
  *(undefined1 (*) [32])out = auVar4;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack8_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;

  return in;
}